

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.c
# Opt level: O0

int dmrC_dominates(dmr_C *C,pseudo_t pseudo,instruction *insn,instruction *dom,int local)

{
  uint uVar1;
  int iVar2;
  int opcode;
  int local_local;
  instruction *dom_local;
  instruction *insn_local;
  pseudo_t pseudo_local;
  dmr_C *C_local;
  
  uVar1 = *(uint *)dom & 0xff;
  if ((uVar1 == 0x35) || (uVar1 == 1)) {
    C_local._4_4_ = -1;
    if (local != 0) {
      C_local._4_4_ = 0;
    }
  }
  else if ((uVar1 == 0x29) || (uVar1 == 0x2a)) {
    if ((dom->field_6).field_1.bb_true == (basic_block *)pseudo) {
      iVar2 = same_memop(insn,dom);
      if (iVar2 == 0) {
        if (((undefined1  [64])*dom & (undefined1  [64])0xff) == (undefined1  [64])0x29) {
          C_local._4_4_ = -1;
        }
        else {
          iVar2 = overlapping_memop(C,insn,dom);
          if (iVar2 == 0) {
            C_local._4_4_ = 0;
          }
          else {
            C_local._4_4_ = -1;
          }
        }
      }
      else {
        C_local._4_4_ = 1;
      }
    }
    else if (local == 0) {
      iVar2 = distinct_symbols((insn->field_6).field_4.phi_src,(dom->field_6).field_4.phi_src);
      if (iVar2 == 0) {
        C_local._4_4_ = -1;
      }
      else {
        C_local._4_4_ = 0;
      }
    }
    else {
      C_local._4_4_ = 0;
    }
  }
  else {
    C_local._4_4_ = 0;
  }
  return C_local._4_4_;
}

Assistant:

int dmrC_dominates(struct dmr_C *C, pseudo_t pseudo, struct instruction *insn, struct instruction *dom, int local)
{
	int opcode = dom->opcode;

	if (opcode == OP_CALL || opcode == OP_ENTRY)
		return local ? 0 : -1;
	if (opcode != OP_LOAD && opcode != OP_STORE)
		return 0;
	if (dom->src != pseudo) {
		if (local)
			return 0;
		/* We don't think two explicitly different symbols ever alias */
		if (distinct_symbols(insn->src, dom->src))
			return 0;
		/* We could try to do some alias analysis here */
		return -1;
	}
	if (!same_memop(insn, dom)) {
		// TODO I think I changed this to fix some simplification issue
		// http://marc.info/?l=linux-sparse&m=148966371314267&w=2
		if (dom->opcode == OP_LOAD)
			return -1;
		if (!overlapping_memop(C, insn, dom))
			return 0;
		return -1;
	}
	return 1;
}